

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::selectConstant
          (CodegenVisitor *this,SQInteger target,SQObject *constant)

{
  int *in_RDX;
  CodegenVisitor *in_RSI;
  SQInteger in_RDI;
  SQFuncState *unaff_retaddr;
  SQObjectType ctype;
  int in_stack_0000003c;
  SQObject *in_stack_00000040;
  SQFuncState *in_stack_00000048;
  SQInteger in_stack_ffffffffffffffd0;
  SQFloat value;
  int iVar1;
  int iVar2;
  SQInteger SVar3;
  
  iVar1 = *in_RDX;
  value = (SQFloat)((ulong)in_RDI >> 0x20);
  if (iVar1 == 0x1000008) {
    SQFuncState::AddInstruction
              (unaff_retaddr,(SQOpcode)value,(SQInteger)in_RSI,(SQInteger)in_RDX,0x100000801000008,
               in_RDI);
  }
  else if (iVar1 == 0x5000002) {
    EmitLoadConstInt(in_RSI,(SQInteger)in_RDX,0x500000205000002);
  }
  else if (iVar1 == 0x5000004) {
    EmitLoadConstFloat((CodegenVisitor *)0x500000405000004,value,in_stack_ffffffffffffffd0);
  }
  else {
    iVar2 = iVar1;
    SVar3 = in_RDI;
    SQFuncState::GetConstant(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
    SQFuncState::AddInstruction
              (unaff_retaddr,(SQOpcode)((ulong)SVar3 >> 0x20),(SQInteger)in_RSI,(SQInteger)in_RDX,
               CONCAT44(iVar2,iVar1),in_RDI);
  }
  return;
}

Assistant:

void CodegenVisitor::selectConstant(SQInteger target, const SQObject &constant) {
    SQObjectType ctype = sq_type(constant);
    switch (ctype) {
    case OT_INTEGER: EmitLoadConstInt(_integer(constant), target); break;
    case OT_FLOAT: EmitLoadConstFloat(_float(constant), target); break;
    case OT_BOOL: _fs->AddInstruction(_OP_LOADBOOL, target, _integer(constant)); break;
    default: _fs->AddInstruction(_OP_LOAD, target, _fs->GetConstant(constant)); break;
    }
}